

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

void hydro_random_ensure_initialized(void)

{
  int iVar1;
  undefined8 in_RAX;
  uint8_t tag;
  long *in_FS_OFFSET;
  uint8_t *unaff_retaddr;
  
  tag = (uint8_t)((ulong)in_RAX >> 0x38);
  if (*(char *)(*in_FS_OFFSET + -8) == '\0') {
    iVar1 = hydro_random_init();
    if (iVar1 != 0) {
      abort();
    }
    gimli_core_u8(unaff_retaddr,tag);
    hydro_random_ratchet();
    *(undefined1 *)(*in_FS_OFFSET + -8) = 1;
  }
  return;
}

Assistant:

static void
hydro_random_ensure_initialized(void)
{
    if (hydro_random_context.initialized == 0) {
        if (hydro_random_init() != 0) {
            abort();
        }
        gimli_core_u8(hydro_random_context.state, 0);
        hydro_random_ratchet();
        hydro_random_context.initialized = 1;
    }
}